

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall enact::Parser::Parser(Parser *this,CompileContext *context)

{
  allocator<char> local_31;
  string local_30;
  
  this->m_context = context;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  Lexer::Lexer(&this->m_scanner,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->m_previous).type = LEFT_PAREN;
  (this->m_previous).lexeme._M_dataplus._M_p = (pointer)&(this->m_previous).lexeme.field_2;
  (this->m_previous).lexeme._M_string_length = 0;
  (this->m_previous).lexeme.field_2._M_local_buf[0] = '\0';
  (this->m_previous).line = 0;
  (this->m_previous).col = 0;
  (this->m_current).type = LEFT_PAREN;
  (this->m_current).lexeme._M_dataplus._M_p = (pointer)&(this->m_current).lexeme.field_2;
  (this->m_current).lexeme._M_string_length = 0;
  (this->m_current).lexeme.field_2._M_local_buf[0] = '\0';
  (this->m_current).line = 0;
  (this->m_current).col = 0;
  this->m_hadError = false;
  return;
}

Assistant:

Parser::Parser(CompileContext &context) : m_context{context} {
    }